

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen_Capture_Example.cpp
# Opt level: O2

void createwindowgrabber(void)

{
  ostream *poVar1;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> w;
  undefined1 local_e8 [16];
  code *local_d8;
  code *local_d0;
  long *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  long *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  long *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  _Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> local_90;
  __shared_ptr<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2> local_78;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"blizzard",(allocator<char> *)local_e8);
  getWindowToCapture((vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>
                      *)&local_90,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (local_90._M_impl.super__Vector_impl_data._M_start ==
      local_90._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "In order to test window capturing, you must modify the getWindowToCapture() function to search for a window that actually exists!"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    LOCK();
    realcounter.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    LOCK();
    onNewFramecounter.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    local_e8._0_8_ = (element_type *)0x0;
    local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&framgrabber.
               super___shared_ptr<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2>
                *)local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
    local_e8._0_8_ = (element_type *)0x0;
    local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d0 = std::
               _Function_handler<std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]screen_capture_lite/Example_CPP/Screen_Capture_Example.cpp:315:56)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]screen_capture_lite/Example_CPP/Screen_Capture_Example.cpp:315:56)>
               ::_M_manager;
    SL::Screen_Capture::CreateCaptureConfiguration((function *)&local_c0);
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]screen_capture_lite/Example_CPP/Screen_Capture_Example.cpp:320:26)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]screen_capture_lite/Example_CPP/Screen_Capture_Example.cpp:320:26)>
               ::_M_manager;
    (**(code **)(*local_c0 + 0x10))(&local_b0);
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<void_(const_SL::Screen_Capture::Image_*,_const_SL::Screen_Capture::MousePoint_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]screen_capture_lite/Example_CPP/Screen_Capture_Example.cpp:340:30)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(const_SL::Screen_Capture::Image_*,_const_SL::Screen_Capture::MousePoint_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]screen_capture_lite/Example_CPP/Screen_Capture_Example.cpp:340:30)>
               ::_M_manager;
    (**(code **)(*local_b0 + 0x20))(&local_a0);
    (**(code **)(*local_a0 + 0x28))(&local_78);
    std::__shared_ptr<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&framgrabber.
               super___shared_ptr<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2>
              ,&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
    std::_Function_base::~_Function_base((_Function_base *)local_e8);
    local_e8._0_8_ = (element_type *)0x64;
    SL::Screen_Capture::IScreenCaptureManager::setFrameChangeInterval<long,std::ratio<1l,1000l>>
              (framgrabber.
               super___shared_ptr<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(duration<long,_std::ratio<1L,_1000L>_> *)local_e8);
    local_e8._0_8_ = (element_type *)0x64;
    SL::Screen_Capture::IScreenCaptureManager::setMouseChangeInterval<long,std::ratio<1l,1000l>>
              (framgrabber.
               super___shared_ptr<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(duration<long,_std::ratio<1L,_1000L>_> *)local_e8);
  }
  std::_Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::
  ~_Vector_base(&local_90);
  return;
}

Assistant:

void createwindowgrabber()
{
    auto w = getWindowToCapture();
    if (w.empty()) {
        std::cout << "In order to test window capturing, you must modify the getWindowToCapture() function to search for a window that actually exists!" << std::endl;
        return;
    }
    realcounter = 0;
    onNewFramecounter = 0;
    framgrabber = nullptr;
    framgrabber =
        SL::Screen_Capture::CreateCaptureConfiguration([]() {
            auto filtereditems = getWindowToCapture(); 
            return filtereditems;
        })

            ->onNewFrame([&](const SL::Screen_Capture::Image &img, const SL::Screen_Capture::Window &window) {
                // Uncomment the below code to write the image to disk for debugging

                /*
                auto r = realcounter.fetch_add(1);
                 auto s = std::to_string(r) + std::string("WINNEW_") + std::string(".jpg");
                 auto size = Width(img) * Height(img) * sizeof(SL::Screen_Capture::ImageBGRA);
                  auto imgbuffer(std::make_unique<unsigned char[]>(size));
                  ExtractAndConvertToRGBA(img, imgbuffer.get(), size);
                  tje_encode_to_file(s.c_str(), Width(img), Height(img), 4, (const unsigned char*)imgbuffer.get());
                  */

                if (std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - onNewFramestart).count() >=
                    1000) {
                    std::cout << "onNewFrame fps" << onNewFramecounter << std::endl;
                    onNewFramecounter = 0;
                    onNewFramestart = std::chrono::high_resolution_clock::now();
                }
                onNewFramecounter += 1;
            })
            ->onMouseChanged([&](const SL::Screen_Capture::Image *img, const SL::Screen_Capture::MousePoint &mousepoint) {
                // Uncomment the below code to write the image to disk for debugging
                /*
                auto r = realcounter.fetch_add(1);
                auto s = std::to_string(r) + std::string(" M") + std::string(".png");
                if (img) {
                    std::cout << "New mouse coordinates  AND NEW Image received."
                              << " x= " << mousepoint.Position.x << " y= " << mousepoint.Position.y << std::endl;
                    lodepng::encode(s, (unsigned char *)StartSrc(*img), Width(*img), Height(*img));
                }
                else {
                    std::cout << "New mouse coordinates received."
                              << " x= " << mousepoint.Position.x << " y= " << mousepoint.Position.y << " The mouse image is still the same as the last
                "
                              << std::endl;
                }
                */
            })
            ->start_capturing();

    framgrabber->setFrameChangeInterval(std::chrono::milliseconds(100));
    framgrabber->setMouseChangeInterval(std::chrono::milliseconds(100));
}